

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2d.cpp
# Opt level: O2

void __thiscall
Texture2D::Texture2D(Texture2D *this,uint8_t *data,uint32_t w,uint32_t h,bool alpha,bool mps)

{
  uint32_t uVar1;
  int iVar2;
  undefined7 in_register_00000081;
  
  this->m_width = w;
  this->m_height = h;
  iVar2 = (int)CONCAT71(in_register_00000081,alpha);
  uVar1 = 0x8051;
  if (iVar2 != 0) {
    uVar1 = 0x8058;
  }
  this->m_internal_format = uVar1;
  this->m_image_format = iVar2 + 0x1907;
  this->m_mipmaps = mps;
  this->m_filterMin = 0x2703;
  this->m_filterMag = 0x2601;
  init_texture(this);
  set_data_immutable(this,data);
  gen_mipmap(this);
  return;
}

Assistant:

Texture2D::Texture2D(const uint8_t* data, uint32_t w, uint32_t h, bool alpha, bool mps)
    : m_width(w), 
      m_height(h), 
      m_internal_format(alpha ? GL_RGBA8 : GL_RGB8),
      m_image_format(alpha ? GL_RGBA : GL_RGB),
      m_mipmaps(mps),
      m_filterMin(GL_LINEAR_MIPMAP_LINEAR),
      m_filterMag(GL_LINEAR)
{
    DERR("Texture def CONSTR");

    init_texture();
    set_data_immutable(data);

    // Generate Mipmaps
    gen_mipmap();
}